

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob-filter.c++
# Opt level: O1

bool __thiscall kj::GlobFilter::matches(GlobFilter *this,StringPtr name)

{
  Vector<unsigned_int> *this_00;
  char c;
  RemoveConst<unsigned_int> *pRVar1;
  uint *puVar2;
  size_t sVar3;
  StringPtr *pSVar4;
  ulong uVar5;
  StringPtr *pSVar6;
  RemoveConst<kj::StringPtr> *pRVar7;
  StringPtr *pSVar8;
  uint *target;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  StringPtr *pSVar12;
  char *pcVar13;
  bool bVar14;
  Vector<unsigned_int> scratch;
  Vector<unsigned_int> oldStates;
  ArrayBuilder<kj::StringPtr> local_78;
  StringPtr *local_58;
  StringPtr *pSStack_50;
  StringPtr *local_48;
  ArrayDisposer *pAStack_40;
  char *local_38;
  
  pcVar13 = name.content.ptr;
  this_00 = &this->states;
  puVar9 = (this->states).builder.ptr;
  (this->states).builder.pos = puVar9;
  if (puVar9 == (this->states).builder.endPtr) {
    Vector<unsigned_int>::setCapacity(this_00,4);
  }
  pRVar1 = (this->states).builder.pos;
  *pRVar1 = 0;
  (this->states).builder.pos = pRVar1 + 1;
  local_78.ptr = (StringPtr *)0x0;
  local_78.pos = (StringPtr *)0x0;
  local_78.endPtr = (StringPtr *)0x0;
  local_78.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_38 = pcVar13 + (name.content.size_ - 1);
  if (local_38 != pcVar13) {
    do {
      c = *pcVar13;
      local_58 = (StringPtr *)(this->states).builder.ptr;
      pSStack_50 = (StringPtr *)(this->states).builder.pos;
      local_48 = (StringPtr *)(this->states).builder.endPtr;
      pAStack_40 = (this->states).builder.disposer;
      (this_00->builder).ptr = (uint *)0x0;
      (this->states).builder.pos = (RemoveConst<unsigned_int> *)0x0;
      (this->states).builder.endPtr = (uint *)0x0;
      ArrayBuilder<unsigned_int>::operator=(&this_00->builder,&local_78);
      puVar9 = (this->states).builder.ptr;
      puVar2 = (this->states).builder.endPtr;
      (this->states).builder.pos = puVar9;
      if ((c == '\\') || (pSVar12 = local_58, pSVar4 = pSStack_50, c == '/')) {
        if (puVar9 == puVar2) {
          Vector<unsigned_int>::setCapacity(this_00,4);
        }
        pRVar1 = (this->states).builder.pos;
        *pRVar1 = 0;
        (this->states).builder.pos = pRVar1 + 1;
        pSVar12 = local_58;
        pSVar4 = pSStack_50;
      }
      for (; pSVar8 = local_78.endPtr, pRVar7 = local_78.pos, pSVar6 = local_78.ptr,
          pSVar12 != pSVar4; pSVar12 = (StringPtr *)((long)&(pSVar12->content).ptr + 4)) {
        applyState(this,c,*(uint *)&(pSVar12->content).ptr);
      }
      if (local_78.ptr != (StringPtr *)0x0) {
        local_78.ptr = (StringPtr *)0x0;
        local_78.pos = (RemoveConst<kj::StringPtr> *)0x0;
        local_78.endPtr = (StringPtr *)0x0;
        (**(local_78.disposer)->_vptr_ArrayDisposer)
                  (local_78.disposer,pSVar6,4,(long)pRVar7 - (long)pSVar6 >> 2,
                   (long)pSVar8 - (long)pSVar6 >> 2,0);
      }
      local_78.ptr = local_58;
      local_78.pos = pSStack_50;
      local_78.endPtr = local_48;
      local_78.disposer = pAStack_40;
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 != local_38);
  }
  pSVar12 = local_78.endPtr;
  pRVar7 = local_78.pos;
  pSVar4 = local_78.ptr;
  puVar9 = (this->states).builder.ptr;
  puVar2 = (this->states).builder.pos;
  bVar14 = puVar9 != puVar2;
  if (bVar14) {
    sVar3 = (this->pattern).content.size_;
    uVar10 = 0;
    if (sVar3 != 0) {
      uVar10 = sVar3 - 1;
    }
    do {
      uVar11 = *puVar9;
      do {
        uVar5 = (ulong)uVar11;
        if (uVar10 <= uVar5) break;
        uVar11 = uVar11 + 1;
      } while ((this->pattern).content.ptr[uVar5] == '*');
      if (uVar10 == uVar5) break;
      puVar9 = puVar9 + 1;
      bVar14 = puVar9 != puVar2;
    } while (bVar14);
  }
  if (local_78.ptr != (StringPtr *)0x0) {
    local_78.ptr = (StringPtr *)0x0;
    local_78.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_78.endPtr = (StringPtr *)0x0;
    (**(local_78.disposer)->_vptr_ArrayDisposer)
              (local_78.disposer,pSVar4,4,(long)pRVar7 - (long)pSVar4 >> 2,
               (long)pSVar12 - (long)pSVar4 >> 2,0);
  }
  return bVar14;
}

Assistant:

bool GlobFilter::matches(StringPtr name) {
  // Get out your computer science books. We're implementing a non-deterministic finite automaton.
  //
  // Our NDFA has one "state" corresponding to each character in the pattern.
  //
  // As you may recall, an NDFA can be transformed into a DFA where every state in the DFA
  // represents some combination of states in the NDFA. Therefore, we actually have to store a
  // list of states here. (Actually, what we really want is a set of states, but because our
  // patterns are mostly non-cyclic a list of states should work fine and be a bit more efficient.)

  // Our state list starts out pointing only at the start of the pattern.
  states.resize(0);
  states.add(0);

  Vector<uint> scratch;

  // Iterate through each character in the name.
  for (char c: name) {
    // Pull the current set of states off to the side, so that we can populate `states` with the
    // new set of states.
    Vector<uint> oldStates = kj::mv(states);
    states = kj::mv(scratch);
    states.resize(0);

    // The pattern can omit a leading path. So if we're at a '/' then enter the state machine at
    // the beginning on the next char.
    if (c == '/' || c == '\\') {
      states.add(0);
    }

    // Process each state.
    for (uint state: oldStates) {
      applyState(c, state);
    }

    // Store the previous state vector for reuse.
    scratch = kj::mv(oldStates);
  }

  // If any one state is at the end of the pattern (or at a wildcard just before the end of the
  // pattern), we have a match.
  for (uint state: states) {
    while (state < pattern.size() && pattern[state] == '*') {
      ++state;
    }
    if (state == pattern.size()) {
      return true;
    }
  }
  return false;
}